

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O1

float Gia_ManDelayTraceLut(Gia_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  uint uVar6;
  Vec_Flt_t *pVVar7;
  float *pfVar8;
  Vec_Int_t *pVVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  size_t __size;
  long lVar13;
  int iVar14;
  ulong uVar15;
  Gia_Obj_t *pGVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  pvVar2 = p->pLutLib;
  if ((pvVar2 == (void *)0x0) ||
     (iVar11 = *(int *)((long)pvVar2 + 8), iVar5 = Gia_ManLutSizeMax(p), iVar5 <= iVar11)) {
    if (p->vTiming != (Vec_Flt_t *)0x0) {
      __assert_fail("p->vTiming == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x22f,"void Gia_ManTimeStart(Gia_Man_t *)");
    }
    pVVar7 = (Vec_Flt_t *)malloc(0x10);
    pVVar7->nCap = 0;
    pVVar7->nSize = 0;
    pVVar7->pArray = (float *)0x0;
    p->vTiming = pVVar7;
    if (pVVar7 == (Vec_Flt_t *)0x0) {
      __assert_fail("p->vTiming != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x22e,"void Gia_ManTimeClean(Gia_Man_t *)");
    }
    iVar11 = p->nObjs;
    uVar15 = (long)iVar11 * 3;
    iVar5 = (int)uVar15;
    if (pVVar7->nCap < iVar5) {
      __size = (long)iVar11 * 0xc;
      if (pVVar7->pArray == (float *)0x0) {
        pfVar8 = (float *)malloc(__size);
      }
      else {
        pfVar8 = (float *)realloc(pVVar7->pArray,__size);
      }
      pVVar7->pArray = pfVar8;
      pVVar7->nCap = iVar5;
    }
    if (0 < iVar11) {
      memset(pVVar7->pArray,0,(uVar15 & 0xffffffff) << 2);
    }
    pVVar7->nSize = iVar5;
    iVar11 = p->nObjs;
    if (0 < (long)iVar11) {
      pVVar7 = p->vTiming;
      iVar5 = pVVar7->nSize;
      lVar13 = 0;
      do {
        if ((long)iVar5 <= lVar13 + 1) goto LAB_0071bcff;
        pVVar7->pArray[lVar13 + 1] = 1e+09;
        lVar13 = lVar13 + 3;
      } while ((long)iVar11 * 3 != lVar13);
    }
    if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
      Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
    }
    iVar11 = p->nObjs;
    if ((0 < iVar11) && (pGVar16 = p->pObjs, pGVar16 != (Gia_Obj_t *)0x0)) {
      lVar17 = 0;
      lVar13 = 0;
      do {
        uVar10 = (uint)*(undefined8 *)pGVar16;
        if (((uVar10 & 0x9fffffff) == 0x9fffffff) ||
           ((int)uVar10 < 0 && (~uVar10 & 0x1fffffff) != 0)) {
LAB_0071b874:
          fVar18 = Gia_ObjComputeArrival(p,(int)lVar13,1);
          if ((((uint)*(undefined8 *)pGVar16 & 0x9fffffff) == 0x9fffffff) &&
             ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0)) {
            fVar18 = Tim_ManGetCiArrival((Tim_Man_t *)p->pManTime,
                                         (uint)((ulong)*(undefined8 *)pGVar16 >> 0x20) & 0x1fffffff)
            ;
          }
          uVar10 = (uint)*(undefined8 *)pGVar16;
          if (((~uVar10 & 0x1fffffff) != 0 && (int)uVar10 < 0) &&
             ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0)) {
            Tim_ManSetCoArrival((Tim_Man_t *)p->pManTime,
                                (uint)((ulong)*(undefined8 *)pGVar16 >> 0x20) & 0x1fffffff,fVar18);
          }
          if (p->vTiming->nSize <= (int)lVar17) goto LAB_0071bcff;
          p->vTiming->pArray[lVar17] = fVar18;
        }
        else {
          if (p->vMapping->nSize <= lVar13) goto LAB_0071bd5c;
          if (p->vMapping->pArray[lVar13] != 0) goto LAB_0071b874;
        }
        lVar13 = lVar13 + 1;
        iVar11 = p->nObjs;
        if (iVar11 <= lVar13) break;
        pGVar16 = p->pObjs + lVar13;
        lVar17 = lVar17 + 3;
      } while (p->pObjs != (Gia_Obj_t *)0x0);
    }
    pVVar9 = p->vCos;
    iVar5 = pVVar9->nSize;
    lVar13 = (long)iVar5;
    if (lVar13 < 1) {
      fVar18 = -1e+09;
    }
    else {
      piVar3 = pVVar9->pArray;
      fVar18 = -1e+09;
      lVar17 = 0;
      do {
        iVar1 = piVar3[lVar17];
        if (((long)iVar1 < 0) || (iVar11 <= iVar1)) goto LAB_0071bd1e;
        pGVar16 = p->pObjs;
        if (pGVar16 == (Gia_Obj_t *)0x0) break;
        pGVar4 = pGVar16 + iVar1 + -(ulong)((uint)*(undefined8 *)(pGVar16 + iVar1) & 0x1fffffff);
        if ((pGVar4 < pGVar16) || (pGVar16 + iVar11 <= pGVar4)) goto LAB_0071bd9a;
        uVar15 = (ulong)((long)pGVar4 - (long)pGVar16) >> 2;
        iVar14 = (int)uVar15;
        if (iVar14 * -0x55555555 < 0) goto LAB_0071bd3d;
        uVar10 = p->vTiming->nSize;
        if ((int)uVar10 <= iVar14) goto LAB_0071bd3d;
        uVar6 = iVar1 * 3;
        if (uVar10 == uVar6 || SBORROW4(uVar10,uVar6) != (int)(uVar10 + iVar1 * -3) < 0)
        goto LAB_0071bcff;
        pfVar8 = p->vTiming->pArray;
        fVar19 = pfVar8[uVar15 & 0xffffffff];
        pfVar8[uVar6] = fVar19;
        if (fVar19 <= fVar18) {
          fVar19 = fVar18;
        }
        fVar18 = fVar19;
        lVar17 = lVar17 + 1;
      } while (lVar13 != lVar17);
    }
    if ((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0) {
      if (0 < iVar5) {
        piVar3 = pVVar9->pArray;
        lVar17 = 0;
        do {
          uVar10 = piVar3[lVar17];
          if (((int)uVar10 < 0) || (iVar11 <= (int)uVar10)) goto LAB_0071bd1e;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (p->vTiming->nSize <= (int)(uVar10 * 3 + 1)) goto LAB_0071bcff;
          p->vTiming->pArray[(ulong)uVar10 * 3 + 1] = fVar18;
          lVar17 = lVar17 + 1;
        } while (lVar13 != lVar17);
      }
    }
    else {
      Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
      Tim_ManInitPoRequiredAll((Tim_Man_t *)p->pManTime,fVar18);
    }
    pVVar9 = Gia_ManOrderReverse(p);
    if (0 < pVVar9->nSize) {
      lVar13 = 0;
      do {
        uVar10 = pVVar9->pArray[lVar13];
        uVar15 = (ulong)uVar10;
        if (((int)uVar10 < 0) || (p->nObjs <= (int)uVar10)) {
LAB_0071bd1e:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->vMapping->nSize <= (int)uVar10) {
LAB_0071bd5c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (p->vMapping->pArray[uVar15] == 0) {
          pGVar16 = p->pObjs + uVar15;
          uVar6 = (uint)*(undefined8 *)pGVar16;
          uVar12 = (uint)((ulong)*(undefined8 *)pGVar16 >> 0x20);
          if ((uVar6 & 0x9fffffff) == 0x9fffffff) {
            if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
              if (p->vTiming->nSize <= (int)(uVar10 * 3 + 1)) goto LAB_0071bd3d;
              Tim_ManSetCiRequired
                        ((Tim_Man_t *)p->pManTime,uVar12 & 0x1fffffff,
                         p->vTiming->pArray[uVar15 * 3 + 1]);
            }
          }
          else if ((~uVar6 & 0x1fffffff) != 0 && (int)uVar6 < 0) {
            if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
              fVar19 = Tim_ManGetCoRequired((Tim_Man_t *)p->pManTime,uVar12 & 0x1fffffff);
              if (p->vTiming->nSize <= (int)(uVar10 * 3 + 1)) {
LAB_0071bcff:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                              ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
              }
              p->vTiming->pArray[uVar15 * 3 + 1] = fVar19;
            }
            pGVar4 = p->pObjs;
            if ((pGVar16 < pGVar4) || (pGVar4 + p->nObjs <= pGVar16)) {
LAB_0071bd9a:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar11 = (int)((ulong)((long)pGVar16 - (long)pGVar4) >> 2) * -0x55555555 -
                     (*(uint *)pGVar16 & 0x1fffffff);
            if (iVar11 < 0) {
LAB_0071bd3d:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecFlt.h"
                            ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
            }
            uVar6 = iVar11 * 3 + 1;
            iVar11 = p->vTiming->nSize;
            if ((iVar11 <= (int)uVar6) || (uVar12 = uVar10 * 3 + 1, iVar11 <= (int)uVar12))
            goto LAB_0071bd3d;
            pfVar8 = p->vTiming->pArray;
            if (pfVar8[uVar12] < pfVar8[uVar6]) {
              pfVar8[uVar6] = pfVar8[uVar12];
            }
          }
        }
        else {
          Gia_ObjPropagateRequired(p,uVar10,1);
        }
        uVar6 = uVar10 * 3 + 1;
        iVar11 = p->vTiming->nSize;
        if (iVar11 <= (int)uVar6) goto LAB_0071bd3d;
        pfVar8 = p->vTiming->pArray;
        fVar19 = pfVar8[uVar6] - pfVar8[uVar10 * 3];
        if (fVar19 + 0.01 <= 0.0) {
          __assert_fail("tSlack + 0.01 > 0.0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSpeedup.c"
                        ,0x13d,"float Gia_ManDelayTraceLut(Gia_Man_t *)");
        }
        uVar10 = uVar10 * 3 + 2;
        if (iVar11 <= (int)uVar10) goto LAB_0071bcff;
        fVar20 = 0.0;
        if (0.0 <= fVar19) {
          fVar20 = fVar19;
        }
        pfVar8[uVar10] = fVar20;
        lVar13 = lVar13 + 1;
      } while (lVar13 < pVVar9->nSize);
    }
    if (pVVar9->pArray != (int *)0x0) {
      free(pVVar9->pArray);
      pVVar9->pArray = (int *)0x0;
    }
    if (pVVar9 != (Vec_Int_t *)0x0) {
      free(pVVar9);
    }
  }
  else {
    uVar10 = *(uint *)((long)pvVar2 + 8);
    uVar6 = Gia_ManLutSizeMax(p);
    printf("The max LUT size (%d) is less than the max fanin count (%d).\n",(ulong)uVar10,
           (ulong)uVar6);
    fVar18 = -1e+09;
  }
  return fVar18;
}

Assistant:

float Gia_ManDelayTraceLut( Gia_Man_t * p )
{
    int fUseSorting = 1;
    If_LibLut_t * pLutLib = (If_LibLut_t *)p->pLutLib;
    Vec_Int_t * vObjs;
    Gia_Obj_t * pObj;
    float tArrival, tArrivalCur, tRequired, tSlack;
    int i, iObj;

    // get the library
    if ( pLutLib && pLutLib->LutMax < Gia_ManLutSizeMax(p) )
    {
        printf( "The max LUT size (%d) is less than the max fanin count (%d).\n", 
            pLutLib->LutMax, Gia_ManLutSizeMax(p) );
        return -TIM_ETERNITY;
    }

    // initialize the arrival times
    Gia_ManTimeStart( p );

    // propagate arrival times
    if ( p->pManTime )
        Tim_ManIncrementTravId( (Tim_Man_t *)p->pManTime );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( !Gia_ObjIsCi(pObj) && !Gia_ObjIsCo(pObj) && !Gia_ObjIsLut(p, i) )
            continue;
        tArrival = Gia_ObjComputeArrival( p, i, fUseSorting );
        if ( Gia_ObjIsCi(pObj) && p->pManTime )
        {
            tArrival = Tim_ManGetCiArrival( (Tim_Man_t *)p->pManTime, Gia_ObjCioId(pObj) );
//printf( "%.3f  ", tArrival );
        }
        if ( Gia_ObjIsCo(pObj) && p->pManTime )
            Tim_ManSetCoArrival( (Tim_Man_t *)p->pManTime, Gia_ObjCioId(pObj), tArrival );
        Gia_ObjSetTimeArrival( p, i, tArrival );
    }

    // get the latest arrival times
    tArrival = -TIM_ETERNITY;
    Gia_ManForEachCo( p, pObj, i )
    {
        tArrivalCur = Gia_ObjTimeArrivalObj( p, Gia_ObjFanin0(pObj) );
        Gia_ObjSetTimeArrival( p, Gia_ObjId(p,pObj), tArrivalCur );
        if ( tArrival < tArrivalCur )
            tArrival = tArrivalCur;
    }

    // initialize the required times
    if ( p->pManTime )
    {
        Tim_ManIncrementTravId( (Tim_Man_t *)p->pManTime );
        Tim_ManInitPoRequiredAll( (Tim_Man_t *)p->pManTime, tArrival );
    }
    else
    {
        Gia_ManForEachCo( p, pObj, i )
            Gia_ObjSetTimeRequiredObj( p, pObj, tArrival );
    }

    // propagate the required times
    vObjs = Gia_ManOrderReverse( p );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        pObj = Gia_ManObj(p, iObj);
        if ( Gia_ObjIsLut(p, iObj) )
        {
            Gia_ObjPropagateRequired( p, iObj, fUseSorting );
        }
        else if ( Gia_ObjIsCi(pObj) )
        {
            if ( p->pManTime )
                Tim_ManSetCiRequired( (Tim_Man_t *)p->pManTime, Gia_ObjCioId(pObj), Gia_ObjTimeRequired(p, iObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            if ( p->pManTime )
            {
                tRequired = Tim_ManGetCoRequired( (Tim_Man_t *)p->pManTime, Gia_ObjCioId(pObj) );
                Gia_ObjSetTimeRequired( p, iObj, tRequired );
            }
            if ( Gia_ObjTimeRequired(p, Gia_ObjFaninId0p(p, pObj)) > Gia_ObjTimeRequired(p, iObj) )
                Gia_ObjSetTimeRequired(p, Gia_ObjFaninId0p(p, pObj), Gia_ObjTimeRequired(p, iObj) );
        }

        // set slack for this object
        tSlack = Gia_ObjTimeRequired(p, iObj) - Gia_ObjTimeArrival(p, iObj);
        assert( tSlack + 0.01 > 0.0 );
        Gia_ObjSetTimeSlack( p, iObj, tSlack < 0.0 ? 0.0 : tSlack );
    }
    Vec_IntFree( vObjs );
    return tArrival;
}